

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O0

bool __thiscall ON_3dmView::IsValid(ON_3dmView *this,ON_TextLog *text_log)

{
  double dVar1;
  bool bVar2;
  bool local_19;
  bool rc;
  ON_TextLog *text_log_local;
  ON_3dmView *this_local;
  
  bVar2 = ON_Viewport::IsValid(&this->m_vp,text_log);
  local_19 = (bool)(-bVar2 & 1);
  if (local_19 != false) {
    switch(this->m_view_type) {
    case model_view_type:
      dVar1 = (this->m_page_settings).m_width_mm;
      if (((dVar1 != 0.0) || (NAN(dVar1))) ||
         ((dVar1 = (this->m_page_settings).m_height_mm, dVar1 != 0.0 || (NAN(dVar1))))) {
        if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,
                            "ON_3dmView has m_view_type = ON::model_view_type but m_page_settings width,height = (%g,%g) (both should be zero).\n"
                            ,(this->m_page_settings).m_width_mm,(this->m_page_settings).m_height_mm)
          ;
        }
        local_19 = false;
      }
      break;
    case page_view_type:
      if (((this->m_page_settings).m_width_mm <= 0.0) ||
         ((this->m_page_settings).m_height_mm <= 0.0)) {
        if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,
                            "ON_3dmView has m_view_type = ON::page_view_type but page width,height = (%g,%g)\n"
                            ,(this->m_page_settings).m_width_mm,(this->m_page_settings).m_height_mm)
          ;
        }
        local_19 = false;
      }
      break;
    case nested_view_type:
      dVar1 = (this->m_page_settings).m_width_mm;
      if ((((dVar1 != 0.0) || (NAN(dVar1))) ||
          (dVar1 = (this->m_page_settings).m_height_mm, dVar1 != 0.0)) || (NAN(dVar1))) {
        if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,
                            "ON_3dmView has m_view_type = ON::nested_view_type but m_page_settings width,height = (%g,%g) (both should be zero).\n"
                            ,(this->m_page_settings).m_width_mm,(this->m_page_settings).m_height_mm)
          ;
        }
        local_19 = false;
      }
      break;
    case uveditor_view_type:
      break;
    case blockeditor_view_type:
      break;
    default:
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"ON_3dmView m_view_type = %d (illegal enum value)\n",
                          (ulong)this->m_view_type);
      }
      local_19 = false;
    }
  }
  return local_19;
}

Assistant:

bool ON_3dmView::IsValid(ON_TextLog* text_log) const
{
  bool rc = m_vp.IsValid(text_log)?true:false;
  while(rc)
  {
    switch(m_view_type)
    {
    case ON::model_view_type:
      if ( m_page_settings.m_width_mm != 0.0 || m_page_settings.m_height_mm != 0.0 )
      {
        if ( text_log )
        {
          text_log->Print("ON_3dmView has m_view_type = ON::model_view_type but m_page_settings width,height = (%g,%g) (both should be zero).\n",
                          m_page_settings.m_width_mm,
                          m_page_settings.m_height_mm);
        }
        rc = false;
      }
      //if (    m_nested_view_position.m_min.x != 0.0 || m_nested_view_position.m_max.x != 0.0
      //     || m_nested_view_position.m_min.y != 0.0 || m_nested_view_position.m_max.y != 0.0
      //     || m_nested_view_position.m_min.z != 0.0 || m_nested_view_position.m_max.z != 0.0 )
      //{
      //  if ( text_log )
      //  {
      //    text_log->Print("ON_3dmView has m_view_type = ON::model_view_type and m_nested_view_position is not identically zero.\n");
      //  }
      //  rc = false;
      //}
      //if ( !ON_UuidIsNil(m_parent_viewport_id) )
      //{
      //  if ( text_log )
      //  {
      //    text_log->Print("ON_3dmView has m_view_type = ON::model_view_type and m_parent_viewport_id is not nil\n");
      //  }
      //  rc = false;
      //}
      break;
    case ON::page_view_type:
      //if (    m_nested_view_position.m_min.x != 0.0 || m_nested_view_position.m_max.x != 0.0
      //     || m_nested_view_position.m_min.y != 0.0 || m_nested_view_position.m_max.y != 0.0
      //     || m_nested_view_position.m_min.z != 0.0 || m_nested_view_position.m_max.z != 0.0 )
      //{
      //  if ( text_log )
      //  {
      //    text_log->Print("ON_3dmView has m_view_type = ON::page_view_type and m_nested_view_position is not identically zero.\n");
      //  }
      //  rc = false;
      //}
      //if ( !ON_UuidIsNil(m_parent_viewport_id) )
      //{
      //  if ( text_log )
      //  {
      //    text_log->Print("ON_3dmView has m_view_type = ON::page_view_type and m_parent_viewport_id is not nil\n");
      //  }
      //  rc = false;
      //}
      if ( m_page_settings.m_width_mm <= 0.0 || m_page_settings.m_height_mm <= 0.0 )
      {
        if ( text_log )
        {
          text_log->Print("ON_3dmView has m_view_type = ON::page_view_type but page width,height = (%g,%g)\n",
                          m_page_settings.m_width_mm,
                          m_page_settings.m_height_mm);
        }
        rc = false;
      }
      break;

    case ON::nested_view_type:
      if ( m_page_settings.m_width_mm != 0.0 || m_page_settings.m_height_mm != 0.0 )
      {
        if ( text_log )
        {
          text_log->Print("ON_3dmView has m_view_type = ON::nested_view_type but m_page_settings width,height = (%g,%g) (both should be zero).\n",
                          m_page_settings.m_width_mm,
                          m_page_settings.m_height_mm);
        }
        rc = false;
      }
      //if ( ON_UuidIsNil(m_parent_viewport_id) )
      //{
      //  if ( text_log )
      //  {
      //    text_log->Print("ON_3dmView has m_view_type = ON::nested_view_type and m_parent_viewport_id is nil.\n");
      //  }
      //  rc = false;
      //}

      //if ( !m_nested_view_position.IsValid() 
      //     || m_nested_view_position.m_min.x >= m_nested_view_position.m_max.x
      //     || m_nested_view_position.m_min.y >= m_nested_view_position.m_max.y
      //     || m_nested_view_position.m_min.z != m_nested_view_position.m_max.z )
      //{
      //  if ( text_log )
      //  {
      //    text_log->Print("ON_3dmView has m_view_type = ON::nested_view_type and m_nested_view_position is bogus.\n");
      //  }
      //  rc = false;
      //}
      break;

    case ON::uveditor_view_type:
      break;

    case ON::blockeditor_view_type:
      break;

    default:
      if ( text_log )
      {
        text_log->Print("ON_3dmView m_view_type = %d (illegal enum value)\n",m_view_type);
      }
      rc = false;
      break;
    }
    if (rc)
      break;




    break;
  }
  return rc;
}